

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceVisitor.hpp
# Opt level: O0

void __thiscall
netlist::InstanceVisitor::handleInstanceMemberPorts(InstanceVisitor *this,InstanceSymbol *symbol)

{
  bool bVar1;
  Symbol *pSVar2;
  Symbol *in_RDI;
  Netlist *unaff_retaddr;
  NetlistPortDeclaration *portNode;
  Symbol *member;
  iterator __end2;
  iterator __begin2;
  InstanceVisitor *in_stack_00000030;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  *__range2;
  iterator *in_stack_ffffffffffffffa8;
  Scope *in_stack_ffffffffffffffc0;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  local_28;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  *local_18;
  Symbol *symbol_00;
  
  symbol_00 = in_RDI;
  local_28 = slang::ast::Scope::members(in_stack_ffffffffffffffc0);
  local_18 = &local_28;
  std::ranges::
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  ::begin(local_18);
  std::ranges::
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  ::end(local_18);
  while( true ) {
    bVar1 = slang::operator==<slang::ast::Scope::iterator>
                      ((self_type *)in_RDI,in_stack_ffffffffffffffa8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pSVar2 = slang::iterator_facade<slang::ast::Scope::iterator,_false>::operator*
                       ((iterator_facade<slang::ast::Scope::iterator,_false> *)0x1c1e0d);
    if (pSVar2->kind == Port) {
      Netlist::addPortDeclaration(unaff_retaddr,symbol_00);
      connectPortInternal(in_stack_00000030,(NetlistNode *)__begin2.current);
    }
    slang::iterator_facade<slang::ast::Scope::iterator,_false>::
    operator++<slang::ast::Scope::iterator>
              ((iterator_facade<slang::ast::Scope::iterator,_false> *)in_RDI);
  }
  return;
}

Assistant:

auto handleInstanceMemberPorts(ast::InstanceSymbol const& symbol) {

        for (auto& member : symbol.body.members()) {
            if (member.kind == ast::SymbolKind::Port) {
                // Create the port declaration netlist node and connect it to
                // the corresponding local variable declaration.
                auto& portNode = netlist.addPortDeclaration(member);
                connectPortInternal(portNode);
            }
        }
    }